

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O1

void __thiscall CMud::LoadObjLimits(CMud *this)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  size_t sVar10;
  FILE *__stream;
  char *pcVar11;
  char *pcVar12;
  OBJ_INDEX_DATA *pOVar13;
  int *piVar14;
  pointer pbVar15;
  short *psVar16;
  long lVar17;
  pointer pbVar18;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  CDirectory dir;
  ofstream player_list;
  char temp_player_name [4608];
  char strPlr [4608];
  char chkbuf [4608];
  long *local_38f0;
  long local_38e8;
  long local_38e0 [2];
  CLogger *local_38d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38c8;
  pointer local_38b0;
  pointer local_38a8;
  string local_38a0;
  string local_3880;
  char *local_3860;
  CDirectory local_3858;
  long local_3838;
  filebuf local_3830 [240];
  ios_base local_3740 [264];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_38d0 = (CLogger *)&this->field_0x140;
  fmt._M_str = "Loading object counts off players now...";
  fmt._M_len = 0x28;
  CLogger::Info<>(local_38d0,fmt);
  local_3880._M_dataplus._M_p = (pointer)&local_3880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3880,"../player","");
  CDirectory::CDirectory(&local_3858,&local_3880);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3880._M_dataplus._M_p != &local_3880.field_2) {
    operator_delete(local_3880._M_dataplus._M_p,local_3880.field_2._M_allocated_capacity + 1);
  }
  local_38a0._M_dataplus._M_p = (pointer)&local_38a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38a0,".plr","");
  CDirectory::GetFiles(&local_38c8,&local_3858,&local_38a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38a0._M_dataplus._M_p != &local_38a0.field_2) {
    operator_delete(local_38a0._M_dataplus._M_p,local_38a0.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_3838,"../player/Player.lst",_S_trunc);
  pbVar15 = local_38c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_38c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar18 = local_38c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar18->_M_dataplus)._M_p;
      local_38f0 = local_38e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38f0,pcVar1,pcVar1 + pbVar18->_M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_3838,(char *)local_38f0,local_38e8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (local_38f0 != local_38e0) {
        operator_delete(local_38f0,local_38e0[0] + 1);
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar15);
  }
  std::ofstream::close();
  sprintf(local_1238,"%s/%s","../player","Zzz.plr");
  local_38b0 = local_38c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar15 = local_38c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_38c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_38f0 = local_38e0;
      pcVar1 = (pbVar15->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38f0,pcVar1,pcVar1 + pbVar15->_M_string_length);
      strcpy(local_2438,(char *)local_38f0);
      if (bDebug == true) {
        sVar10 = strlen(local_2438);
        fmt_00._M_str = local_2438;
        fmt_00._M_len = sVar10;
        CLogger::Debug<>(local_38d0,fmt_00);
      }
      bVar2 = str_cmp(local_2438,local_1238);
      if (!bVar2) {
        if (local_38f0 != local_38e0) {
          operator_delete(local_38f0,local_38e0[0] + 1);
        }
        break;
      }
      local_38a8 = pbVar15;
      __stream = fopen(local_2438,"r");
      if (__stream == (FILE *)0x0) {
        piVar14 = __errno_location();
        local_3860 = strerror(*piVar14);
        fmt_04._M_str = "LoadObjLimits: fopen {}: {}";
        fmt_04._M_len = 0x1b;
        CLogger::Error<char(&)[4608],char*>
                  ((CLogger *)&RS.field_0x140,fmt_04,&local_2438,&local_3860);
        exit(1);
      }
      num_pfiles = num_pfiles + 1;
      while( true ) {
        do {
          local_3638[0] = '\0';
          cVar3 = fread_letter((FILE *)__stream);
        } while (cVar3 != '#');
        pcVar11 = fread_word((FILE *)__stream);
        bVar4 = str_cmp(pcVar11,"End");
        if (!bVar4) goto LAB_00374e20;
        bVar4 = str_cmp(pcVar11,"PLAYER");
        iVar7 = 0;
        iVar8 = 0;
        if (!bVar4) {
          iVar7 = 0;
          iVar8 = 0;
          do {
            pcVar11 = fread_word((FILE *)__stream);
            bVar4 = str_cmp(pcVar11,"Name");
            if (!bVar4 && local_3638[0] == '\0') {
              pcVar12 = fread_string((FILE *)__stream);
              strcpy(local_3638,pcVar12);
            }
            bVar4 = str_cmp(pcVar11,"Cabal");
            if (!bVar4) {
              pcVar12 = fread_string((FILE *)__stream);
              iVar6 = cabal_lookup(pcVar12);
              cabal_members[iVar6] = cabal_members[iVar6] + 1;
            }
            bVar4 = str_cmp(pcVar11,"LogO");
            if (!bVar4 && iVar7 == 0) {
              iVar7 = fread_number((FILE *)__stream);
            }
            bVar4 = str_cmp(pcVar11,"Levl");
            if (!bVar4) {
              iVar8 = fread_number((FILE *)__stream);
            }
            bVar4 = str_cmp(pcVar11,"End");
          } while (bVar4);
        }
        if ((((iVar7 != 0) && (iVar8 != 0)) && (iVar8 < 0x34)) && (iVar7 + 0x34bc00 < current_time))
        break;
        bVar4 = str_cmp(pcVar11,"O");
        if ((!bVar4) || (bVar4 = str_cmp(pcVar11,"OBJECT"), !bVar4)) {
          pcVar11 = fread_word((FILE *)__stream);
          bVar4 = str_cmp(pcVar11,"Vnum");
          if (!bVar4) {
            fread_number((FILE *)__stream);
            pOVar13 = get_obj_index(0);
            if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
              pOVar13 = get_obj_index(0);
              pOVar13->limcount = pOVar13->limcount + 1;
            }
          }
        }
      }
      fmt_01._M_str = "Autodeleting {}.";
      fmt_01._M_len = 0x10;
      CLogger::Info<char(&)[4608]>(local_38d0,fmt_01,&local_3638);
      delete_char(local_3638,true);
LAB_00374e20:
      fclose(__stream);
      if (local_38f0 != local_38e0) {
        operator_delete(local_38f0,local_38e0[0] + 1);
      }
      pbVar15 = local_38a8 + 1;
    } while (bVar2 && local_38a8 + 1 != local_38b0);
  }
  fmt_02._M_str = "Object Limits loaded";
  fmt_02._M_len = 0x14;
  CLogger::Info<>(local_38d0,fmt_02);
  iVar7 = num_pfiles;
  psVar16 = &cabal_table[1].max_members;
  lVar17 = 1;
  do {
    sVar5 = (short)(iVar7 / (int)*psVar16);
    if (sVar5 < 0x10) {
      sVar5 = 0xf;
    }
    cabal_max[lVar17] = sVar5;
    lVar17 = lVar17 + 1;
    psVar16 = psVar16 + 0x14;
  } while (lVar17 != 7);
  fmt_03._M_str = "Cabal Limits loaded";
  fmt_03._M_len = 0x13;
  CLogger::Info<>(local_38d0,fmt_03);
  local_3838 = _VTT;
  *(undefined8 *)(local_3830 + *(long *)(_VTT + -0x18) + -8) = _atoll;
  std::filebuf::~filebuf(local_3830);
  std::ios_base::~ios_base(local_3740);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38c8);
  CDirectory::~CDirectory(&local_3858);
  return;
}

Assistant:

void CMud::LoadObjLimits()
{
	FILE *fpChar;
	char strPlr[MAX_INPUT_LENGTH];
	char chkbuf[MAX_STRING_LENGTH];
	char temp_player_name[MSL];
	char pbuf[100];
	int i;
	long temp_bounty;
	long min_bounty = 0;
	float tempfloat;

	Logger.Info("Loading object counts off players now...");

	auto dir = CDirectory(RIFT_PLAYER_DIR);
	auto files = dir.GetFiles(".plr");

	std::ofstream player_list(PLAYER_LIST, std::ios::trunc);
	for(auto file : files) player_list << file << std::endl;
	player_list.close();

	//for(i=0;i<=MAX_TOP_BOUNTY;i++)
	//      top_bounty_value[i]=0;
	sprintf(chkbuf,"%s/%s", RIFT_PLAYER_DIR,"Zzz.plr");
	for (auto file : files)
	{
		strcpy(strPlr, file.data());
		if(bDebug)
			Logger.Debug(strPlr);

		if (!str_cmp(strPlr,chkbuf))
			break;

		fpChar = fopen(strPlr, "r");
		if (fpChar == nullptr)
		{
			RS.Logger.Error("LoadObjLimits: fopen {}: {}", strPlr, std::strerror(errno));
			exit(1);
		}

		num_pfiles++;
		temp_bounty=0;

		for (; ;)
		{
			int vnum, lastlogin = 0, plevel = 0;
			bool breakout;
			char letter;
			char *word;
			OBJ_INDEX_DATA *pObjIndex;

			temp_player_name[0] = '\0';
			letter = fread_letter(fpChar);

			if (letter != '#')
				continue;

			word = fread_word(fpChar);

			if (!str_cmp(word,"End"))
				break;

			if ( !str_cmp( word, "PLAYER"))
			{
				for ( ; ; )
				{
					word   = fread_word( fpChar );
					//NOTE: Be careful that occurrences of this word INSIDE role/desc don't fuck it up!
					//read before/after role/desc and test accordingly
					if(!str_cmp(word,"Name") && temp_player_name[0] == '\0')
						sprintf(temp_player_name,"%s",fread_string( fpChar ));
					if(!str_cmp(word,"Cabal"))
						cabal_members[cabal_lookup(fread_string(fpChar))]++;
					if(!str_cmp(word,"LogO") && lastlogin == 0)
						lastlogin = fread_number(fpChar);
					if(!str_cmp(word,"Levl"))
						plevel = fread_number(fpChar);
					if(!str_cmp(word,"End"))
						break;
				}
			}

			if(lastlogin && plevel && plevel < 52 && lastlogin + 3456000 < current_time)
			{
				Logger.Info("Autodeleting {}.", temp_player_name);
				breakout = true;
				delete_char(temp_player_name, true);
				break;
			}

			if ( !str_cmp( word, "O") || !str_cmp( word, "OBJECT"))
			{
				word = fread_word(fpChar);

				if (!str_cmp(word, "Vnum"))
				{
					vnum = fread_number(fpChar);
					if ( (get_obj_index(vnum)) != nullptr)
					{
						pObjIndex = get_obj_index(vnum);
						pObjIndex->limcount++;
					}
				}
			}
		}

		fclose(fpChar);
		fpChar = nullptr;
	}